

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

bool EvaluateToBuffer(ExpressionEvalContext *ctx,ExprBase *expression,char *resultBuf,
                     uint resultBufSize)

{
  ExprBase *pEVar1;
  _func_int **pp_Var2;
  
  pEVar1 = Evaluate(ctx,expression);
  if (pEVar1 == (ExprBase *)0x0) goto LAB_0013fc2b;
  if (pEVar1->typeID == 3) {
    pp_Var2 = (_func_int **)(ulong)(byte)pEVar1->field_0x29;
  }
  else if (pEVar1->typeID == 4) {
    pp_Var2 = (_func_int **)(ulong)(uint)(int)(char)pEVar1->field_0x29;
  }
  else {
    if (pEVar1->typeID != 6) {
      if (pEVar1->typeID == 7) {
        NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%f",pEVar1[1]._vptr_ExprBase);
      }
      else {
        NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"unknown");
      }
      goto LAB_0013fc2b;
    }
    pp_Var2 = pEVar1[1]._vptr_ExprBase;
    if (pEVar1->type == ctx->ctx->typeLong) {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%lldL",pp_Var2);
      goto LAB_0013fc2b;
    }
  }
  NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",pp_Var2);
LAB_0013fc2b:
  return pEVar1 != (ExprBase *)0x0;
}

Assistant:

bool EvaluateToBuffer(ExpressionEvalContext &ctx, ExprBase *expression, char *resultBuf, unsigned resultBufSize)
{
	if(ExprBase *value = Evaluate(ctx, expression))
	{
		if(ExprBoolLiteral *result = getType<ExprBoolLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", result->value ? 1 : 0);
		}
		else if(ExprCharacterLiteral *result = getType<ExprCharacterLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", result->value);
		}
		else if(ExprIntegerLiteral *result = getType<ExprIntegerLiteral>(value))
		{
			if(result->type == ctx.ctx.typeLong)
				NULLC::SafeSprintf(resultBuf, resultBufSize, "%lldL", result->value);
			else
				NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", int(result->value));
		}
		else if(ExprRationalLiteral *result = getType<ExprRationalLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%f", result->value);
		}
		else
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "unknown");
		}

		return true;
	}

	return false;
}